

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_model_t * fsg_model_init(char *name,logmath_t *lmath,float32 lw,int32 n_state)

{
  fsg_model_t *pfVar1;
  listelem_alloc_t *plVar2;
  trans_list_t *ptVar3;
  char *local_30;
  fsg_model_t *fsg;
  int32 n_state_local;
  float32 lw_local;
  logmath_t *lmath_local;
  char *name_local;
  
  pfVar1 = (fsg_model_t *)
           __ckd_calloc__(1,0x58,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x1f6);
  pfVar1->refcount = 1;
  plVar2 = listelem_alloc_init(0x10);
  pfVar1->link_alloc = plVar2;
  pfVar1->lmath = lmath;
  if (name == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = __ckd_salloc__(name,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                              ,0x1fa);
  }
  pfVar1->name = local_30;
  pfVar1->n_state = n_state;
  pfVar1->lw = lw;
  ptVar3 = (trans_list_t *)
           __ckd_calloc__((long)pfVar1->n_state,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x1fe);
  pfVar1->trans = ptVar3;
  return pfVar1;
}

Assistant:

fsg_model_t *
fsg_model_init(char const *name, logmath_t * lmath, float32 lw,
               int32 n_state)
{
    fsg_model_t *fsg;

    /* Allocate basic stuff. */
    fsg = ckd_calloc(1, sizeof(*fsg));
    fsg->refcount = 1;
    fsg->link_alloc = listelem_alloc_init(sizeof(fsg_link_t));
    fsg->lmath = lmath;
    fsg->name = name ? ckd_salloc(name) : NULL;
    fsg->n_state = n_state;
    fsg->lw = lw;

    fsg->trans = ckd_calloc(fsg->n_state, sizeof(*fsg->trans));

    return fsg;
}